

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decimfmt.cpp
# Opt level: O2

DecimalFormat * __thiscall icu_63::DecimalFormat::operator=(DecimalFormat *this,DecimalFormat *rhs)

{
  DecimalFormatFields *pDVar1;
  DecimalFormatSymbols *pDVar2;
  DecimalFormatSymbols *this_00;
  DecimalFormatProperties *size;
  
  size = (rhs->fields->properties).
         super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr;
  icu_63::number::impl::DecimalFormatProperties::operator=
            ((this->fields->properties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr,size);
  icu_63::number::impl::DecimalFormatProperties::clear
            ((this->fields->exportedProperties).
             super_LocalPointerBase<icu_63::number::impl::DecimalFormatProperties>.ptr);
  pDVar1 = this->fields;
  this_00 = (DecimalFormatSymbols *)UMemory::operator_new((UMemory *)0xb00,(size_t)size);
  if (this_00 != (DecimalFormatSymbols *)0x0) {
    DecimalFormatSymbols::DecimalFormatSymbols
              (this_00,(rhs->fields->symbols).
                       super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr);
  }
  pDVar2 = (pDVar1->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr;
  if (pDVar2 != (DecimalFormatSymbols *)0x0) {
    (*(pDVar2->super_UObject)._vptr_UObject[1])();
  }
  (pDVar1->symbols).super_LocalPointerBase<const_icu_63::DecimalFormatSymbols>.ptr = this_00;
  touchNoError(this);
  return this;
}

Assistant:

DecimalFormat& DecimalFormat::operator=(const DecimalFormat& rhs) {
    *fields->properties = *rhs.fields->properties;
    fields->exportedProperties->clear();
    fields->symbols.adoptInstead(new DecimalFormatSymbols(*rhs.fields->symbols));
    touchNoError();
    return *this;
}